

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  uint64_t *puVar2;
  int iVar3;
  char *__nptr;
  long lVar4;
  secp256k1_context *psVar5;
  secp256k1_scalar *psVar6;
  secp256k1_gej *psVar7;
  code *pcVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  size_t __size;
  long lVar12;
  size_t count;
  uchar c [10];
  bench_data data;
  uchar buf [32];
  int in_stack_fffffffffffffeb8;
  int local_144;
  undefined6 local_140;
  undefined1 uStack_13a;
  undefined1 uStack_139;
  undefined2 local_138;
  bench_data local_130;
  secp256k1_sha256 local_c8;
  uchar local_58 [40];
  
  __nptr = getenv("SECP256K1_BENCH_ITERS");
  if (__nptr == (char *)0x0) {
    iVar9 = 10000;
  }
  else {
    lVar4 = strtol(__nptr,(char **)0x0,0);
    iVar9 = (int)lVar4;
  }
  local_130.ecmult_multi = secp256k1_ecmult_multi_var;
  if (argc < 2) {
LAB_00120ee7:
    psVar5 = secp256k1_context_create(1);
    lVar4 = 8;
    local_130.ctx = psVar5;
    do {
      lVar11 = lVar4;
      if ((long)argc * 8 == lVar11) goto LAB_00120f32;
      iVar3 = strcmp(*(char **)((long)argv + lVar11),"simple");
      lVar4 = lVar11 + 8;
    } while (iVar3 != 0);
    if ((long)argc * 8 == lVar11) {
LAB_00120f32:
      local_130.scratch = (secp256k1_scratch_space *)malloc(0x4580070);
      if (local_130.scratch == (secp256k1_scratch_space *)0x0) {
        (*(psVar5->error_callback).fn)("Out of memory",(psVar5->error_callback).data);
      }
      else {
        (local_130.scratch)->magic[0] = '\0';
        (local_130.scratch)->magic[1] = '\0';
        (local_130.scratch)->magic[2] = '\0';
        (local_130.scratch)->magic[3] = '\0';
        (local_130.scratch)->magic[4] = '\0';
        (local_130.scratch)->magic[5] = '\0';
        (local_130.scratch)->magic[6] = '\0';
        (local_130.scratch)->magic[7] = '\0';
        (local_130.scratch)->data = (void *)0x0;
        (local_130.scratch)->alloc_size = 0;
        (local_130.scratch)->max_size = 0;
        builtin_memcpy((local_130.scratch)->magic,"scratch",8);
        (local_130.scratch)->data = local_130.scratch + 1;
        (local_130.scratch)->max_size = 0x4580050;
      }
    }
    else {
      local_130.scratch = (secp256k1_scratch_space *)0x0;
    }
    local_130.scalars = (secp256k1_scalar *)malloc(0x100000);
    psVar6 = (secp256k1_scalar *)malloc(0x100000);
    local_130.seckeys = psVar6;
    local_130.pubkeys = (secp256k1_ge *)malloc(0x2c0000);
    psVar7 = (secp256k1_gej *)malloc(0x400000);
    __size = (long)iVar9 * 0x80 + 0x80;
    local_130.pubkeys_gej = psVar7;
    local_130.expected_output = (secp256k1_gej *)malloc(__size);
    local_130.output = (secp256k1_gej *)malloc(__size);
    psVar7->infinity = 0;
    (psVar7->x).n[4] = 0x79be667ef9dc;
    (psVar7->x).n[2] = 0xe870b07029bfc;
    (psVar7->x).n[3] = 0xbbac55a06295c;
    (psVar7->x).n[0] = 0x2815b16f81798;
    (psVar7->x).n[1] = 0xdb2dce28d959f;
    (psVar7->y).n[4] = 0x483ada7726a3;
    (psVar7->y).n[2] = 0xe1108a8fd17b4;
    (psVar7->y).n[3] = 0xc4655da4fbfc0;
    (psVar7->y).n[0] = 0x7d08ffb10d4b8;
    (psVar7->y).n[1] = 0x48a68554199c4;
    (psVar7->z).n[0] = 1;
    (psVar7->z).n[3] = 0;
    (psVar7->z).n[4] = 0;
    (psVar7->z).n[1] = 0;
    (psVar7->z).n[2] = 0;
    psVar6->d[0] = 1;
    psVar6->d[1] = 0;
    psVar6->d[2] = 0;
    psVar6->d[3] = 0;
    lVar12 = 0;
    lVar11 = 0;
    lVar4 = 0;
    do {
      puVar2 = (local_130.scalars)->d;
      local_138 = 0;
      local_144 = 0;
      _local_140 = CONCAT17((char)((ulong)lVar4 >> 8),CONCAT16((char)lVar4,0x746c756d6365));
      local_c8.s._0_5_ = 0x856a09e667;
      local_c8.s[1]._1_2_ = 0x67ae;
      local_c8.s[1]._3_1_ = 0xbb;
      local_c8.s[2]._0_2_ = 0xf372;
      local_c8.s[2]._2_1_ = 0x6e;
      local_c8.s[2]._3_1_ = 0x3c;
      local_c8.s[3] = 0xa54ff53a;
      local_c8.s[4] = 0x510e527f;
      local_c8.s[5] = 0x9b05688c;
      local_c8.s[6] = 0x1f83d9ab;
      local_c8.s[7] = 0x5be0cd19;
      local_c8.bytes = 0;
      secp256k1_sha256_write(&local_c8,(uchar *)&local_140,10);
      secp256k1_sha256_finalize(&local_c8,local_58);
      secp256k1_scalar_set_b32((secp256k1_scalar *)((long)puVar2 + lVar11),local_58,&local_144);
      if (local_144 != 0) {
        main_cold_1();
        goto LAB_00121412;
      }
      if (lVar11 != 0) {
        if (*(int *)((long)((local_130.pubkeys_gej)->x).n + lVar11 * 4 + -8) == 0) {
          secp256k1_gej_double
                    ((secp256k1_gej *)((long)((local_130.pubkeys_gej)->x).n + lVar12),
                     (secp256k1_gej *)((long)local_130.pubkeys_gej[-1].x.n + lVar12));
        }
        else {
          puVar1 = (undefined8 *)((long)((local_130.pubkeys_gej)->x).n + lVar11 * 4);
          *(undefined4 *)(puVar1 + 0xf) = 1;
          puVar1[0xc] = 0;
          puVar1[0xd] = 0;
          puVar1[10] = 0;
          puVar1[0xb] = 0;
          puVar1[8] = 0;
          puVar1[9] = 0;
          puVar1[6] = 0;
          puVar1[7] = 0;
          puVar1[4] = 0;
          puVar1[5] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1[0xe] = 0;
        }
        psVar6 = (secp256k1_scalar *)((long)local_130.seckeys[-1].d + lVar11);
        secp256k1_scalar_add
                  ((secp256k1_scalar *)((long)(local_130.seckeys)->d + lVar11),psVar6,psVar6);
      }
      lVar4 = lVar4 + 1;
      lVar11 = lVar11 + 0x20;
      lVar12 = lVar12 + 0x80;
    } while (lVar11 != 0x100000);
    secp256k1_ge_set_all_gej_var(local_130.pubkeys,local_130.pubkeys_gej,0x8000);
    printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
           "    Max(us)    ");
    putchar(10);
    local_130.offset1 = 0x2481;
    local_130.offset2 = 0xf49;
    local_c8.s._0_5_ = 0x6c756d6365;
    local_c8.s[1]._1_2_ = 0x5f74;
    local_c8.s[1]._3_1_ = 0x67;
    local_c8.s[2]._0_2_ = 0x6e65;
    local_c8.s[2]._2_1_ = 0;
    run_benchmark((char *)&local_c8,bench_ecmult_gen,bench_ecmult_setup,bench_ecmult_gen_teardown,
                  &local_130,iVar9,in_stack_fffffffffffffeb8);
    local_c8.s[2]._0_2_ = 0x6e6f;
    local_c8.s[2]._2_1_ = 0x73;
    local_c8.s[2]._3_1_ = 0x74;
    local_c8.s[3] = local_c8.s[3] & 0xffffff00;
    local_c8.s._0_5_ = 0x6c756d6365;
    local_c8.s[1]._1_2_ = 0x5f74;
    local_c8.s[1]._3_1_ = 99;
    run_benchmark((char *)&local_c8,bench_ecmult_const,bench_ecmult_setup,
                  bench_ecmult_const_teardown,&local_130,iVar9,in_stack_fffffffffffffeb8);
    local_c8.s._0_5_ = 0x6c756d6365;
    local_c8.s[1]._1_2_ = 0x5f74;
    local_c8.s[1]._3_1_ = 0x31;
    local_c8.s[2]._0_2_ = 0x70;
    run_benchmark((char *)&local_c8,bench_ecmult_1p,bench_ecmult_setup,bench_ecmult_1p_teardown,
                  &local_130,iVar9,in_stack_fffffffffffffeb8);
    local_c8.s[2]._0_2_ = 0x5f70;
    local_c8.s[2]._2_1_ = 0x67;
    local_c8.s[2]._3_1_ = 0;
    local_c8.s._0_5_ = 0x6c756d6365;
    local_c8.s[1]._1_2_ = 0x5f74;
    local_c8.s[1]._3_1_ = 0x30;
    run_benchmark((char *)&local_c8,bench_ecmult_0p_g,bench_ecmult_setup,bench_ecmult_0p_g_teardown,
                  &local_130,iVar9,in_stack_fffffffffffffeb8);
    local_c8.s[2]._0_2_ = 0x5f70;
    local_c8.s[2]._2_1_ = 0x67;
    local_c8.s[2]._3_1_ = 0;
    local_c8.s._0_5_ = 0x6c756d6365;
    local_c8.s[1]._1_2_ = 0x5f74;
    local_c8.s[1]._3_1_ = 0x31;
    pcVar8 = bench_ecmult_1p_g_teardown;
    run_benchmark((char *)&local_c8,bench_ecmult_1p_g,bench_ecmult_setup,bench_ecmult_1p_g_teardown,
                  &local_130,iVar9 * 2,in_stack_fffffffffffffeb8);
    count = 1;
    do {
      run_ecmult_multi_bench(&local_130,count,iVar9,(int)pcVar8);
      count = count + 1;
    } while (count != 9);
    if (2 < iVar9) {
      iVar3 = 0;
      do {
        iVar10 = 9;
        do {
          run_ecmult_multi_bench
                    (&local_130,(ulong)(uint)(iVar10 << ((byte)iVar3 & 0x1f)),iVar9,iVar3);
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0x11);
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0xc);
    }
    if (local_130.scratch != (secp256k1_scratch_space *)0x0) {
      lVar4 = 0;
      do {
        iVar9 = (uint)(local_130.scratch)->magic[lVar4] - (uint)(byte)"scratch"[lVar4];
        if ((local_130.scratch)->magic[lVar4] != "scratch"[lVar4]) goto LAB_0012138d;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      iVar9 = 0;
LAB_0012138d:
      if (iVar9 == 0) {
        (local_130.scratch)->magic[0] = '\0';
        (local_130.scratch)->magic[1] = '\0';
        (local_130.scratch)->magic[2] = '\0';
        (local_130.scratch)->magic[3] = '\0';
        (local_130.scratch)->magic[4] = '\0';
        (local_130.scratch)->magic[5] = '\0';
        (local_130.scratch)->magic[6] = '\0';
        (local_130.scratch)->magic[7] = '\0';
        free(local_130.scratch);
      }
      else {
        (*((local_130.ctx)->error_callback).fn)
                  ("invalid scratch space",((local_130.ctx)->error_callback).data);
      }
    }
    secp256k1_context_destroy(local_130.ctx);
    free(local_130.scalars);
    free(local_130.pubkeys);
    free(local_130.pubkeys_gej);
    free(local_130.seckeys);
    free(local_130.output);
    free(local_130.expected_output);
  }
  else {
    lVar11 = (ulong)(uint)argc << 3;
    lVar4 = 8;
    do {
      lVar12 = lVar4;
      if (lVar11 == lVar12) goto LAB_00120db6;
      iVar3 = strcmp(*(char **)((long)argv + lVar12),"-h");
      lVar4 = lVar12 + 8;
    } while (iVar3 != 0);
    if (lVar11 == lVar12) {
LAB_00120db6:
      lVar4 = 8;
      do {
        lVar12 = lVar4;
        if (lVar11 == lVar12) goto LAB_00120de3;
        iVar3 = strcmp(*(char **)((long)argv + lVar12),"--help");
        lVar4 = lVar12 + 8;
      } while (iVar3 != 0);
      if (lVar11 == lVar12) {
LAB_00120de3:
        lVar4 = 8;
        do {
          lVar12 = lVar4;
          if (lVar11 == lVar12) goto LAB_00120e1d;
          iVar3 = strcmp(*(char **)((long)argv + lVar12),"help");
          lVar4 = lVar12 + 8;
        } while (iVar3 != 0);
        if (lVar11 == lVar12) {
LAB_00120e1d:
          lVar4 = 8;
          do {
            lVar12 = lVar4;
            if (lVar11 == lVar12) goto LAB_00120e5f;
            iVar3 = strcmp(*(char **)((long)argv + lVar12),"pippenger_wnaf");
            lVar4 = lVar12 + 8;
          } while (iVar3 != 0);
          if (lVar11 == lVar12) {
LAB_00120e5f:
            lVar4 = 8;
            do {
              lVar12 = lVar4;
              if (lVar11 == lVar12) goto LAB_00120ea6;
              iVar3 = strcmp(*(char **)((long)argv + lVar12),"strauss_wnaf");
              lVar4 = lVar12 + 8;
            } while (iVar3 != 0);
            if (lVar11 == lVar12) {
LAB_00120ea6:
              lVar4 = 8;
              do {
                lVar12 = lVar4;
                if (lVar11 == lVar12) goto LAB_00121412;
                iVar3 = strcmp(*(char **)((long)argv + lVar12),"simple");
                lVar4 = lVar12 + 8;
              } while (iVar3 != 0);
              if (lVar11 == lVar12) {
LAB_00121412:
                main_cold_2();
                return 1;
              }
              puts("Using simple algorithm:");
            }
            else {
              puts("Using strauss_wnaf:");
              local_130.ecmult_multi = secp256k1_ecmult_strauss_batch_single;
            }
          }
          else {
            puts("Using pippenger_wnaf:");
            local_130.ecmult_multi = secp256k1_ecmult_pippenger_batch_single;
          }
          goto LAB_00120ee7;
        }
      }
    }
    help(argv);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    bench_data data;
    int i, p;
    size_t scratch_size;

    int iters = get_iters(10000);

    data.ecmult_multi = secp256k1_ecmult_multi_var;

    if (argc > 1) {
        if(have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(argv);
            return EXIT_SUCCESS;
        } else if(have_flag(argc, argv, "pippenger_wnaf")) {
            printf("Using pippenger_wnaf:\n");
            data.ecmult_multi = secp256k1_ecmult_pippenger_batch_single;
        } else if(have_flag(argc, argv, "strauss_wnaf")) {
            printf("Using strauss_wnaf:\n");
            data.ecmult_multi = secp256k1_ecmult_strauss_batch_single;
        } else if(have_flag(argc, argv, "simple")) {
            printf("Using simple algorithm:\n");
        } else {
            fprintf(stderr, "%s: unrecognized argument '%s'.\n\n", argv[0], argv[1]);
            help(argv);
            return EXIT_FAILURE;
        }
    }

    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    scratch_size = secp256k1_strauss_scratch_size(POINTS) + STRAUSS_SCRATCH_OBJECTS*16;
    if (!have_flag(argc, argv, "simple")) {
        data.scratch = secp256k1_scratch_space_create(data.ctx, scratch_size);
    } else {
        data.scratch = NULL;
    }

    /* Allocate stuff */
    data.scalars = malloc(sizeof(secp256k1_scalar) * POINTS);
    data.seckeys = malloc(sizeof(secp256k1_scalar) * POINTS);
    data.pubkeys = malloc(sizeof(secp256k1_ge) * POINTS);
    data.pubkeys_gej = malloc(sizeof(secp256k1_gej) * POINTS);
    data.expected_output = malloc(sizeof(secp256k1_gej) * (iters + 1));
    data.output = malloc(sizeof(secp256k1_gej) * (iters + 1));

    /* Generate a set of scalars, and private/public keypairs. */
    secp256k1_gej_set_ge(&data.pubkeys_gej[0], &secp256k1_ge_const_g);
    secp256k1_scalar_set_int(&data.seckeys[0], 1);
    for (i = 0; i < POINTS; ++i) {
        generate_scalar(i, &data.scalars[i]);
        if (i) {
            secp256k1_gej_double_var(&data.pubkeys_gej[i], &data.pubkeys_gej[i - 1], NULL);
            secp256k1_scalar_add(&data.seckeys[i], &data.seckeys[i - 1], &data.seckeys[i - 1]);
        }
    }
    secp256k1_ge_set_all_gej_var(data.pubkeys, data.pubkeys_gej, POINTS);


    print_output_table_header_row();
    /* Initialize offset1 and offset2 */
    hash_into_offset(&data, 0);
    run_ecmult_bench(&data, iters);

    for (i = 1; i <= 8; ++i) {
        run_ecmult_multi_bench(&data, i, 1, iters);
    }

    /* This is disabled with low count of iterations because the loop runs 77 times even with iters=1
    * and the higher it goes the longer the computation takes(more points)
    * So we don't run this benchmark with low iterations to prevent slow down */
     if (iters > 2) {
        for (p = 0; p <= 11; ++p) {
            for (i = 9; i <= 16; ++i) {
                run_ecmult_multi_bench(&data, i << p, 1, iters);
            }
        }
    }

    if (data.scratch != NULL) {
        secp256k1_scratch_space_destroy(data.ctx, data.scratch);
    }
    secp256k1_context_destroy(data.ctx);
    free(data.scalars);
    free(data.pubkeys);
    free(data.pubkeys_gej);
    free(data.seckeys);
    free(data.output);
    free(data.expected_output);

    return EXIT_SUCCESS;
}